

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cborencoder.c
# Opt level: O2

CborError cbor_encoder_close_container(CborEncoder *parentEncoder,CborEncoder *containerEncoder)

{
  uint8_t *puVar1;
  CborError CVar2;
  
  puVar1 = containerEncoder->end;
  parentEncoder->end = puVar1;
  parentEncoder->data = containerEncoder->data;
  if ((containerEncoder->flags & 0x10) != 0) {
    CVar2 = append_byte_to_buffer(parentEncoder,0xff);
    return CVar2;
  }
  if (containerEncoder->remaining == 1) {
    return (uint)(puVar1 == (uint8_t *)0x0) << 0x1f;
  }
  return CborErrorTooFewItems - (uint)(containerEncoder->remaining == 0);
}

Assistant:

CborError cbor_encoder_close_container(CborEncoder *parentEncoder, const CborEncoder *containerEncoder)
{
    // synchronise buffer state with that of the container
    parentEncoder->end = containerEncoder->end;
    parentEncoder->data = containerEncoder->data;

    if (containerEncoder->flags & CborIteratorFlag_UnknownLength)
        return append_byte_to_buffer(parentEncoder, BreakByte);

    if (containerEncoder->remaining != 1)
        return containerEncoder->remaining == 0 ? CborErrorTooManyItems : CborErrorTooFewItems;

    if (!parentEncoder->end)
        return CborErrorOutOfMemory;    /* keep the state */

    return CborNoError;
}